

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

mg_server * mg_create_server(void *server_data,mg_handler_t handler)

{
  mg_server *s;
  char *pcVar1;
  long lVar2;
  
  s = (mg_server *)calloc(1,200);
  ns_mgr_init((ns_mgr *)s,server_data);
  for (lVar2 = 0x38; *(long *)((long)&PTR_atoi_001142b0 + lVar2 * 2) != 0; lVar2 = lVar2 + 8) {
    pcVar1 = *(char **)((long)&PTR_exit_001142b8 + lVar2 * 2);
    if (pcVar1 != (char *)0x0 && *(long *)((long)(s->ns_mgr).ctl + lVar2 + -0x10) == 0) {
      pcVar1 = mg_strdup(pcVar1);
      *(char **)((long)(s->ns_mgr).ctl + lVar2 + -0x10) = pcVar1;
    }
  }
  s->event_handler = handler;
  return s;
}

Assistant:

struct mg_server *mg_create_server(void *server_data, mg_handler_t handler) {
  struct mg_server *server = (struct mg_server *) calloc(1, sizeof(*server));
  ns_mgr_init(&server->ns_mgr, server_data);
  set_default_option_values(server->config_options);
  server->event_handler = handler;
  return server;
}